

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

VirtualIterator<Inferences::InductionContext> __thiscall
Inferences::InductionContextFn::operator()
          (InductionContextFn *this,
          pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
          *arg)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  uint uVar4;
  uint uVar5;
  Inference *pIVar6;
  size_type sVar7;
  reference ppTVar8;
  undefined7 extraout_var;
  InductionContext *pIVar9;
  InductionContext *in_RDX;
  InductionContext *in_RSI;
  Clause *in_RDI;
  TermLiteralClause *tqr_1;
  Set<Kernel::Literal_*,_Inferences::SharedTermHash> lits;
  InductionContext ctx_1;
  InductionContext ctx;
  TermList st2;
  TermList st1;
  SubtermIterator sti2;
  SubtermIterator sti1;
  bool match;
  TermLiteralClause *tqr;
  value_type indTerm;
  uint indDepth;
  VirtualIterator<Inferences::InductionContext> *res;
  SubtermIterator *in_stack_fffffffffffffbe8;
  uint in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  TermList in_stack_fffffffffffffbf8;
  SingletonIterator<Inferences::InductionContext> *in_stack_fffffffffffffc00;
  undefined6 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0e;
  undefined1 in_stack_fffffffffffffc0f;
  InductionContext *in_stack_fffffffffffffc10;
  Clause *cl;
  SingletonIterator<Inferences::InductionContext> *in_stack_fffffffffffffc78;
  SingletonIterator<Inferences::InductionContext> *in_stack_fffffffffffffd30;
  VirtualIterator<Inferences::InductionContext> *in_stack_fffffffffffffd38;
  SingletonIterator<Inferences::InductionContext> *pSVar10;
  VirtualIterator<Inferences::InductionContext> local_1a0 [25];
  uint64_t local_d8;
  uint64_t local_d0;
  TermList local_c8;
  TermList local_c0 [11];
  byte local_61;
  long local_50;
  long local_48;
  undefined8 local_38;
  InductionContext *local_30;
  undefined4 local_24;
  undefined1 local_1d;
  uint local_1c;
  
  cl = in_RDI;
  pIVar6 = Kernel::Unit::inference
                     ((Unit *)(in_RSI->_indTerms).
                              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  local_1c = Kernel::Inference::inductionDepth(pIVar6);
  if (local_1c == 0) {
    InductionContext::InductionContext
              (in_stack_fffffffffffffc10,
               (vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *)
               CONCAT17(in_stack_fffffffffffffc0f,
                        CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)),
               (Literal *)in_stack_fffffffffffffc00,(Clause *)in_stack_fffffffffffffbf8._content);
    Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::Set
              ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)0x7edafd);
    Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::insert
              ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)in_stack_fffffffffffffc00,
               (Literal *)in_stack_fffffffffffffbf8._content);
    while (uVar3 = Lib::
                   VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                   ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                              *)0x7edb2a), (bool)uVar3) {
      in_stack_fffffffffffffc00 = in_stack_fffffffffffffd30;
      Lib::
      VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
      ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
              *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffd30 = in_stack_fffffffffffffc00;
      Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>::
      ~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>
                 *)0x7edb6f);
      pSVar10 = in_stack_fffffffffffffc00;
      in_stack_fffffffffffffc0e =
           Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::contains
                     ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)
                      CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)),
                      (Literal *)in_stack_fffffffffffffc00);
      if (!(bool)in_stack_fffffffffffffc0e) {
        in_stack_fffffffffffffbf8._content =
             (uint64_t)
             Kernel::Literal::complementaryLiteral
                       ((Literal *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        bVar2 = Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::contains
                          ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)
                           CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffc0e,
                                                   in_stack_fffffffffffffc08)),
                           (Literal *)in_stack_fffffffffffffc00);
        in_stack_fffffffffffffbf4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffbf4);
        if (!bVar2) {
          Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::insert
                    ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)in_stack_fffffffffffffc00
                     ,(Literal *)in_stack_fffffffffffffbf8._content);
          in_stack_fffffffffffffbf0 = local_1c;
          pIVar6 = Kernel::Unit::inference
                             ((Unit *)(pSVar10->_el)._indTerms.
                                      super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          uVar4 = Kernel::Inference::inductionDepth(pIVar6);
          if (in_stack_fffffffffffffbf0 == uVar4) {
            InductionContext::insert(in_RSI,cl,(Literal *)in_RDI);
          }
        }
      }
    }
    InductionContext::InductionContext
              ((InductionContext *)in_stack_fffffffffffffc00,
               (InductionContext *)in_stack_fffffffffffffbf8._content);
    Lib::getSingletonIterator<Inferences::InductionContext>(in_RDX);
    Lib::pvi<Lib::SingletonIterator<Inferences::InductionContext>>(in_stack_fffffffffffffc78);
    Lib::SingletonIterator<Inferences::InductionContext>::~SingletonIterator
              ((SingletonIterator<Inferences::InductionContext> *)0x7edcd7);
    InductionContext::~InductionContext
              ((InductionContext *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    local_24 = 1;
    Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::~Set
              ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    InductionContext::~InductionContext
              ((InductionContext *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  }
  else {
    local_1d = 0;
    Lib::VirtualIterator<Inferences::InductionContext>::getEmpty();
    sVar7 = std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::size(&in_RDX->_indTerms);
    if (sVar7 < 2) {
      ppTVar8 = std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::operator[]
                          (&in_RDX->_indTerms,0);
      local_30 = (InductionContext *)*ppTVar8;
      bVar2 = Kernel::Literal::isEquality((Literal *)0x7ed520);
      if ((!bVar2) && (uVar4 = Kernel::Term::arity((Term *)local_30), uVar4 != 0)) {
        while (bVar2 = Lib::
                       VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                       ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                                  *)0x7ed583), bVar2) {
          Lib::
          VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
          ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                  *)in_stack_fffffffffffffbe8);
          lVar1 = local_50;
          Indexing::
          QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>::
          ~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>
                     *)0x7ed5c8);
          uVar4 = local_1c;
          local_48 = lVar1;
          pIVar6 = Kernel::Unit::inference(*(Unit **)(lVar1 + 0x18));
          uVar5 = Kernel::Inference::inductionDepth(pIVar6);
          if ((uVar4 == uVar5) &&
             (*(pointer *)(local_48 + 0x18) !=
              (in_RSI->_indTerms).
              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
              super__Vector_impl_data._M_start)) {
            uVar4 = Kernel::Term::functor
                              ((Term *)(in_RSI->_indTerms).
                                       super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
            uVar5 = Kernel::Term::functor(*(Term **)(local_48 + 0x10));
            if (uVar4 == uVar5) {
              local_61 = 0;
              Kernel::SubtermIterator::SubtermIterator
                        ((SubtermIterator *)in_stack_fffffffffffffc10,
                         (Term *)CONCAT17(in_stack_fffffffffffffc0f,
                                          CONCAT16(in_stack_fffffffffffffc0e,
                                                   in_stack_fffffffffffffc08)));
              Kernel::SubtermIterator::SubtermIterator
                        ((SubtermIterator *)in_stack_fffffffffffffc10,
                         (Term *)CONCAT17(in_stack_fffffffffffffc0f,
                                          CONCAT16(in_stack_fffffffffffffc0e,
                                                   in_stack_fffffffffffffc08)));
              while (bVar2 = Kernel::SubtermIterator::hasNext
                                       ((SubtermIterator *)in_stack_fffffffffffffbf8._content),
                    bVar2) {
                bVar2 = Kernel::SubtermIterator::hasNext
                                  ((SubtermIterator *)in_stack_fffffffffffffbf8._content);
                local_38 = CONCAT71(extraout_var,bVar2);
                if (!bVar2) {
                  Kernel::SubtermIterator::~SubtermIterator
                            ((SubtermIterator *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                  Lib::VirtualIterator<Inferences::InductionContext>::~VirtualIterator
                            ((VirtualIterator<Inferences::InductionContext> *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                  _Unwind_Resume(local_38);
                }
                local_c0[0] = Kernel::SubtermIterator::next(in_stack_fffffffffffffbe8);
                local_c8 = Kernel::SubtermIterator::next(in_stack_fffffffffffffbe8);
                bVar2 = Kernel::TermList::operator!=(local_c0,&local_c8);
                if (bVar2) {
                  if ((local_61 & 1) != 0) {
LAB_007ed823:
                    local_61 = 0;
                    break;
                  }
                  local_d0 = local_c8._content;
                  bVar2 = Kernel::TermList::containsSubterm
                                    ((TermList *)
                                     CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                     in_stack_fffffffffffffbf8);
                  if ((!bVar2) ||
                     (pIVar9 = (InductionContext *)Kernel::TermList::term((TermList *)0x7ed7b5),
                     pIVar9 != local_30)) {
                    local_d8 = local_c0[0]._content;
                    bVar2 = Kernel::TermList::containsSubterm
                                      ((TermList *)
                                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0)
                                       ,in_stack_fffffffffffffbf8);
                    if ((!bVar2) ||
                       (in_stack_fffffffffffffc10 =
                             (InductionContext *)Kernel::TermList::term((TermList *)0x7ed80d),
                       in_stack_fffffffffffffc10 != local_30)) goto LAB_007ed823;
                  }
                  Kernel::SubtermIterator::right
                            ((SubtermIterator *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                  Kernel::SubtermIterator::right
                            ((SubtermIterator *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                  local_61 = 1;
                }
              }
              if ((local_61 & 1) == 0) {
                local_24 = 2;
              }
              else {
                InductionContext::InductionContext
                          (in_stack_fffffffffffffc10,
                           (vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *)
                           CONCAT17(in_stack_fffffffffffffc0f,
                                    CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)),
                           (Literal *)in_stack_fffffffffffffc00,
                           (Clause *)in_stack_fffffffffffffbf8._content);
                InductionContext::insert(in_RSI,cl,(Literal *)in_RDI);
                Lib::VirtualIterator<Inferences::InductionContext>::VirtualIterator
                          (local_1a0,(VirtualIterator<Inferences::InductionContext> *)in_RDI);
                InductionContext::InductionContext
                          ((InductionContext *)in_stack_fffffffffffffc00,
                           (InductionContext *)in_stack_fffffffffffffbf8._content);
                Lib::getSingletonIterator<Inferences::InductionContext>(in_RDX);
                Lib::
                concatIters<Lib::VirtualIterator<Inferences::InductionContext>,Lib::SingletonIterator<Inferences::InductionContext>>
                          (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
                Lib::
                pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>>>>>
                          ((IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>_>
                            *)in_stack_fffffffffffffc78);
                Lib::VirtualIterator<Inferences::InductionContext>::operator=
                          ((VirtualIterator<Inferences::InductionContext> *)
                           in_stack_fffffffffffffc00,
                           (VirtualIterator<Inferences::InductionContext> *)
                           in_stack_fffffffffffffbf8._content);
                Lib::VirtualIterator<Inferences::InductionContext>::~VirtualIterator
                          ((VirtualIterator<Inferences::InductionContext> *)
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                Lib::
                IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>_>
                ::~IterTraits((IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>_>
                               *)0x7ed958);
                Lib::SingletonIterator<Inferences::InductionContext>::~SingletonIterator
                          ((SingletonIterator<Inferences::InductionContext> *)0x7ed965);
                InductionContext::~InductionContext
                          ((InductionContext *)
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                Lib::VirtualIterator<Inferences::InductionContext>::~VirtualIterator
                          ((VirtualIterator<Inferences::InductionContext> *)
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                InductionContext::~InductionContext
                          ((InductionContext *)
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
                local_24 = 0;
              }
              Kernel::SubtermIterator::~SubtermIterator
                        ((SubtermIterator *)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
              Kernel::SubtermIterator::~SubtermIterator
                        ((SubtermIterator *)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
            }
          }
        }
      }
    }
  }
  return (VirtualIterator<Inferences::InductionContext>)
         (IteratorCore<Inferences::InductionContext> *)cl;
}

Assistant:

VirtualIterator<InductionContext> operator()(pair<std::vector<Term*>, VirtualIterator<QueryRes<ResultSubstitutionSP, TermLiteralClause>>> arg) {
    auto indDepth = _premise->inference().inductionDepth();
    // heuristic 2
    if (indDepth) {
      auto res = VirtualIterator<InductionContext>::getEmpty();
      // TODO make this work for multiple induction terms
      ASS(arg.first.size() >= 1)
      if (arg.first.size() > 1) {
        return res;
      }
      auto indTerm = arg.first[0];
      // check for complex term and non-equality
      if (_lit->isEquality() || !indTerm->arity()) {
        return res;
      }
      while (arg.second.hasNext()) {
        auto& tqr = *arg.second.next().data;
        if (indDepth != tqr.clause->inference().inductionDepth()) {
          continue;
        }
        // check for different clauses and same topmost functors
        if (tqr.clause == _premise || _lit->functor() != tqr.literal->functor()) {
          continue;
        }
        bool match = false;
        SubtermIterator sti1(_lit);
        SubtermIterator sti2(tqr.literal);
        while (sti1.hasNext()) {
          ALWAYS(sti2.hasNext());
          auto st1 = sti1.next();
          auto st2 = sti2.next();
          if (st1 != st2) {
            // if the two terms are not equal, we check that
            // - no other non-equal pair of terms have been processed (match)
            // - one of them contains the other and the contained one is the induction term
            if (match ||
              !((st1.containsSubterm(st2) && st2.term() == indTerm) ||
                (st2.containsSubterm(st1) && st1.term() == indTerm)))
            {
              match = false;
              break;
            }
            sti1.right();
            sti2.right();
            match = true;
          }
        }
        if (!match) {
          continue;
        }
        InductionContext ctx(arg.first, _lit, _premise);
        ctx.insert(tqr.clause, tqr.literal);
        res = pvi(concatIters(res, getSingletonIterator(ctx)));
      }
      return res;
    // heuristic 1
    } else {
      InductionContext ctx(arg.first, _lit, _premise);
      Set<Literal*,SharedTermHash> lits;
      lits.insert(_lit);
      while (arg.second.hasNext()) {
        auto& tqr = *arg.second.next().data;
        // TODO: having the same literal multiple times or its complement has unwanted effects
        // in the clausification/resolution part, so avoid it for now
        if (lits.contains(tqr.literal) || lits.contains(Literal::complementaryLiteral(tqr.literal))) {
          continue;
        }
        lits.insert(tqr.literal);
        if (indDepth != tqr.clause->inference().inductionDepth()) {
          continue;
        }
        ctx.insert(tqr.clause, tqr.literal);
      }
      return pvi(getSingletonIterator(ctx));
    }
  }